

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall tetgenmesh::reduceedgesatvertex(tetgenmesh *this,point startpt,arraypool *endptlist)

{
  char *pcVar1;
  point endpt;
  long lVar2;
  int iVar3;
  interresult iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  char cVar8;
  bool bVar9;
  triface searchtet;
  int local_bc;
  triface local_b8;
  flipconstraints local_a8;
  
  local_b8.tet = (tetrahedron *)0x0;
  local_b8.ver = 0;
  local_a8.seg[0] = (point)0x0;
  local_a8.fac[0] = (point)0x0;
  local_a8.enqflag = 0;
  local_a8.chkencflag = 0;
  local_a8.unflip = 0;
  local_a8.collectnewtets = 0;
  local_a8.collectencsegflag = 0;
  local_a8.remove_ndelaunay_edge = 0;
  local_a8.bak_tetprism_vol._0_4_ = 0;
  local_a8.bak_tetprism_vol._4_4_ = 0;
  local_a8.tetprism_vol_sum._0_4_ = 0;
  local_a8._36_8_ = 0;
  local_a8.cosdihed_in = 0.0;
  local_a8.cosdihed_out = 0.0;
  local_a8.checkflipeligibility = 1;
  local_a8.remvert = startpt;
  do {
    lVar7 = endptlist->objects;
    if (lVar7 < 1) {
      bVar9 = true;
    }
    else {
      uVar6 = 0;
      local_bc = 0;
      do {
        pcVar1 = endptlist->toparray[(int)uVar6 >> ((byte)endptlist->log2objectsperblock & 0x1f)];
        lVar7 = (long)endptlist->objectbytes * (long)(int)(endptlist->objectsperblockmark & uVar6);
        endpt = *(point *)(pcVar1 + lVar7);
        if (endpt != this->dummypoint) {
          if (this->nonconvex == 0) {
            local_b8.tet = (tetrahedron *)
                           ((ulong)startpt[this->point2simindex] & 0xfffffffffffffff0);
            if (local_b8.tet[4] == (tetrahedron)startpt) {
              local_b8.ver = 0xb;
            }
            else if (local_b8.tet[5] == (tetrahedron)startpt) {
              local_b8.ver = 3;
            }
            else {
              local_b8.ver = 0;
              if (local_b8.tet[6] == (tetrahedron)startpt) {
                local_b8.ver = 7;
              }
            }
            iVar4 = finddirection(this,&local_b8,endpt);
            cVar8 = iVar4 == ACROSSVERT;
          }
          else {
            iVar3 = getedge(this,startpt,endpt,&local_b8);
            cVar8 = (char)iVar3;
          }
          if ((cVar8 == '\0') ||
             ((local_b8.tet[destpivot[local_b8.ver]] == *(tetrahedron *)(pcVar1 + lVar7) &&
              (((local_b8.tet[8] == (tetrahedron)0x0 ||
                (local_b8.tet[8][ver2edge[local_b8.ver]] == (double *)0x0)) &&
               (iVar3 = removeedgebyflips(this,&local_b8,&local_a8), iVar3 == 2)))))) {
            local_bc = local_bc + 1;
            lVar2 = endptlist->objects;
            uVar5 = (int)lVar2 - 1;
            *(undefined8 *)(pcVar1 + lVar7) =
                 *(undefined8 *)
                  (endptlist->toparray[(int)uVar5 >> ((byte)endptlist->log2objectsperblock & 0x1f)]
                  + (long)endptlist->objectbytes *
                    (long)(int)(uVar5 & endptlist->objectsperblockmark));
            endptlist->objects = lVar2 + -1;
            uVar6 = uVar6 - 1;
          }
        }
        uVar6 = uVar6 + 1;
        lVar7 = endptlist->objects;
      } while ((int)uVar6 < lVar7);
      bVar9 = local_bc == 0;
    }
  } while (!bVar9);
  return (int)lVar7;
}

Assistant:

int tetgenmesh::reduceedgesatvertex(point startpt, arraypool* endptlist)
{
  triface searchtet;
  point *pendpt, *parypt;
  enum interresult dir;
  flipconstraints fc;
  int reduceflag;
  int count;
  int n, i, j;


  fc.remvert = startpt;
  fc.checkflipeligibility = 1;

  while (1) {

    count = 0;

    for (i = 0; i < endptlist->objects; i++) {
      pendpt = (point *) fastlookup(endptlist, i);
      if (*pendpt == dummypoint) {
        continue; // Do not reduce a virtual edge.
      }
      reduceflag = 0;
      // Find the edge.
      if (nonconvex) {
        if (getedge(startpt, *pendpt, &searchtet)) {
          dir = ACROSSVERT;
        } else {
          // The edge does not exist (was flipped).
          dir = INTERSECT;
        }
      } else {
        point2tetorg(startpt, searchtet);
        dir = finddirection(&searchtet, *pendpt);
      }
      if (dir == ACROSSVERT) {
        if (dest(searchtet) == *pendpt) {
          // Do not flip a segment.
          if (!issubseg(searchtet)) {
            n = removeedgebyflips(&searchtet, &fc);
            if (n == 2) {
              reduceflag = 1;
            }
          }
        }
      } else {
        // The edge has been flipped.
        reduceflag = 1;
      }
      if (reduceflag) {
        count++;
        // Move the last vertex into this slot.
        j = endptlist->objects - 1;
        parypt = (point *) fastlookup(endptlist, j);
        *pendpt = *parypt;
        endptlist->objects--;
        i--;
      }
    } // i

    if (count == 0) {
      // No edge is reduced.
      break;
    }

  } // while (1)

  return (int) endptlist->objects;
}